

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_test.cc
# Opt level: O0

void __thiscall
DSATest_MissingParameters_Test::~DSATest_MissingParameters_Test
          (DSATest_MissingParameters_Test *this)

{
  DSATest_MissingParameters_Test *this_local;
  
  ~DSATest_MissingParameters_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DSATest, MissingParameters) {
  bssl::UniquePtr<DSA> dsa(DSA_new());
  ASSERT_TRUE(dsa);
  EXPECT_EQ(-1, DSA_verify(0, fips_digest, sizeof(fips_digest), fips_sig,
                           sizeof(fips_sig), dsa.get()));

  std::vector<uint8_t> sig(DSA_size(dsa.get()));
  unsigned sig_len;
  EXPECT_FALSE(DSA_sign(0, fips_digest, sizeof(fips_digest), sig.data(),
                        &sig_len, dsa.get()));
}